

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QList<QByteArray> * __thiscall
QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::operator[]
          (QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *this,KnownHeaders *key)

{
  QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>,_bool>
  pVar3;
  QArrayDataPointer<QByteArray> local_68;
  pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_> local_50;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_*>
          )(QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QNetworkRequest::KnownHeaders,_std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>,_std::_Select1st<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_68.d = (Data *)0x0;
    local_68.ptr = (QByteArray *)0x0;
    local_68.size = 0;
    std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::
    pair<QList<QByteArray>,_true>(&local_50,key,(QList<QByteArray> *)&local_68);
    pVar3 = std::
            _Rb_tree<QNetworkRequest::KnownHeaders,std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>,std::_Select1st<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>,std::less<QNetworkRequest::KnownHeaders>,std::allocator<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>>
            ::_M_insert_unique<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>
                      ((_Rb_tree<QNetworkRequest::KnownHeaders,std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>,std::_Select1st<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>,std::less<QNetworkRequest::KnownHeaders>,std::allocator<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>>
                        *)&pQVar1->m,&local_50);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_50.second.d);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_68);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QList<QByteArray> *)&iVar2._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }